

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::subMinRow(float *cost_graph,int M,int nrows,int ncols)

{
  int iVar1;
  int local_30;
  int j_1;
  float val;
  int j;
  float min;
  int i;
  int ncols_local;
  int nrows_local;
  int M_local;
  float *cost_graph_local;
  
  for (j = 0; j < nrows; j = j + 1) {
    val = cost_graph[j * M];
    for (j_1 = 0; j_1 < ncols; j_1 = j_1 + 1) {
      if (cost_graph[j * M + j_1] < val) {
        val = cost_graph[j * M + j_1];
      }
    }
    for (local_30 = 0; local_30 < ncols; local_30 = local_30 + 1) {
      iVar1 = j * M + local_30;
      cost_graph[iVar1] = cost_graph[iVar1] - val;
    }
  }
  return;
}

Assistant:

void subMinRow(float *cost_graph, const int M, const int nrows,
               const int ncols) {
  for (int i = 0; i < nrows; i++) {
    // find min
    float min = cost_graph[i * M];
    for (int j = 0; j < ncols; j++) {
      float val = cost_graph[i * M + j];
      if (val < min) {
        min = val;
      }
    }

    // subtract min
    for (int j = 0; j < ncols; j++) {
      cost_graph[i * M + j] -= min;
    }
  }
}